

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O0

void png_write_sig(png_structrp png_ptr)

{
  png_byte local_18 [8];
  png_byte png_signature [8];
  png_structrp png_ptr_local;
  
  local_18[0] = 0x89;
  local_18[1] = 'P';
  local_18[2] = 'N';
  local_18[3] = 'G';
  local_18[4] = '\r';
  local_18[5] = '\n';
  local_18[6] = '\x1a';
  local_18[7] = '\n';
  png_ptr->io_state = 0x12;
  png_signature = (png_byte  [8])png_ptr;
  png_write_data(png_ptr,png_signature + ((ulong)png_ptr->sig_bytes - 8),
                 (long)(int)(8 - (uint)png_ptr->sig_bytes));
  if (*(byte *)((long)png_signature + 0x275) < 3) {
    *(uint *)((long)png_signature + 300) = *(uint *)((long)png_signature + 300) | 0x1000;
  }
  return;
}

Assistant:

void PNGAPI
png_write_sig(png_structrp png_ptr)
{
   png_byte png_signature[8] = {137, 80, 78, 71, 13, 10, 26, 10};

#ifdef PNG_IO_STATE_SUPPORTED
   /* Inform the I/O callback that the signature is being written */
   png_ptr->io_state = PNG_IO_WRITING | PNG_IO_SIGNATURE;
#endif

   /* Write the rest of the 8 byte signature */
   png_write_data(png_ptr, &png_signature[png_ptr->sig_bytes],
       (size_t)(8 - png_ptr->sig_bytes));

   if (png_ptr->sig_bytes < 3)
      png_ptr->mode |= PNG_HAVE_PNG_SIGNATURE;
}